

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O1

void __thiscall
sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode::CacheNode
          (CacheNode *this,pair<sjtu::orderType,_long> *value_,locType *offset_,
          LRUCache<std::pair<sjtu::orderType,_long>_> *bel_)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  char (*pacVar9) [41];
  char (*pacVar10) [41];
  value_type local_28;
  pair<sjtu::map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>::iterator,_bool>
  local_18;
  
  uVar3 = *(undefined8 *)(value_->first).username;
  uVar4 = *(undefined8 *)((value_->first).username + 8);
  uVar5 = *(undefined8 *)((value_->first).username + 0x10);
  uVar6 = *(undefined8 *)((value_->first).trainID + 3);
  uVar7 = *(undefined8 *)((value_->first).trainID + 0xd);
  *(undefined8 *)((this->value).first.trainID + 5) = *(undefined8 *)((value_->first).trainID + 5);
  *(undefined8 *)((this->value).first.trainID + 0xd) = uVar7;
  *(undefined8 *)((this->value).first.username + 0x10) = uVar5;
  *(undefined8 *)((this->value).first.trainID + 3) = uVar6;
  *(undefined8 *)(this->value).first.username = uVar3;
  *(undefined8 *)((this->value).first.username + 8) = uVar4;
  lVar8 = 0x2c;
  do {
    pcVar1 = (value_->first).username + lVar8;
    uVar3 = *(undefined8 *)(pcVar1 + 8);
    pcVar2 = (this->value).first.username + lVar8;
    *(undefined8 *)pcVar2 = *(undefined8 *)pcVar1;
    *(undefined8 *)(pcVar2 + 8) = uVar3;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x4c);
  pacVar9 = (value_->first).station;
  pacVar10 = (this->value).first.station;
  for (lVar8 = 0x1b; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined4 *)*pacVar10 = *(undefined4 *)*pacVar9;
    pacVar9 = (char (*) [41])(*pacVar9 + 4);
    pacVar10 = (char (*) [41])(*pacVar10 + 4);
  }
  (this->value).second = value_->second;
  local_28.first = *offset_;
  this->offset = local_28.first;
  this->is_dirty_page = false;
  this->prec = (CacheNode *)0x0;
  this->succ = (CacheNode *)0x0;
  this->bel = bel_;
  local_28.second = this;
  map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>::
  insert(&local_18,&bel_->table,&local_28);
  return;
}

Assistant:

CacheNode(const valueType &value_ , const locType &offset_ , LRUCache<valueType> *bel_) : value(value_) , offset(offset_) , bel(bel_) , is_dirty_page(false) , prec(nullptr) , succ(nullptr)
			{
				bel -> table.insert(std::make_pair(offset , this));
			}